

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dioextra.c
# Opt level: O0

void update_pc_last_fight(CHAR_DATA *ch,CHAR_DATA *ch2)

{
  bool bVar1;
  long in_RSI;
  long in_RDI;
  CHAR_DATA *in_stack_ffffffffffffffe8;
  
  bVar1 = is_npc(in_stack_ffffffffffffffe8);
  if (((!bVar1) && (bVar1 = is_npc(in_stack_ffffffffffffffe8), !bVar1)) && (in_RDI != in_RSI)) {
    *(time_t *)(in_RDI + 0x48) = current_time;
    *(undefined8 *)(in_RDI + 0x50) = *(undefined8 *)(in_RSI + 0xf0);
    *(time_t *)(in_RSI + 0x48) = current_time;
    *(undefined8 *)(in_RSI + 0x50) = *(undefined8 *)(in_RDI + 0xf0);
  }
  return;
}

Assistant:

void update_pc_last_fight(CHAR_DATA *ch, CHAR_DATA *ch2)
{
	if (is_npc(ch) || is_npc(ch2) || ch == ch2)
		return;

	ch->last_fight_time = current_time;
	ch->last_fight_name = ch2->true_name;

	ch2->last_fight_time = current_time;
	ch2->last_fight_name = ch->true_name;
}